

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3gau_io.c
# Opt level: O2

int s3gaucnt_write(char *fn,vector_t ***wt_mean,vector_t ***wt_var,int32 pass2var,float32 ***dnom,
                  uint32 n_cb,uint32 n_feat,uint32 n_density,uint32 *veclen)

{
  float32 ***arr;
  int32 iVar1;
  int iVar2;
  FILE *fp;
  ulong uVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  uint32 d1;
  uint32 chksum;
  uint32 n_cb_local;
  uint32 has_vars;
  uint32 has_means;
  int32 pass2var_local;
  uint32 ignore;
  float32 ***local_38;
  
  chksum = 0;
  ignore = 0;
  n_cb_local = n_cb;
  pass2var_local = pass2var;
  s3clr_fattr();
  s3add_fattr("version","1.0",1);
  s3add_fattr("chksum0","yes",1);
  fp = s3open(fn,"wb",(uint32 *)0x0);
  iVar4 = -1;
  if (fp != (FILE *)0x0) {
    has_means = (uint32)(wt_mean != (vector_t ***)0x0);
    iVar1 = bio_fwrite(&has_means,4,1,fp,0,&chksum);
    if (iVar1 == 1) {
      has_vars = (uint32)(wt_var != (vector_t ***)0x0);
      iVar1 = bio_fwrite(&has_vars,4,1,fp,0,&chksum);
      if ((((iVar1 == 1) && (iVar1 = bio_fwrite(&pass2var_local,4,1,fp,0,&chksum), iVar1 == 1)) &&
          (iVar1 = bio_fwrite(&n_cb_local,4,1,fp,0,&chksum), iVar1 == 1)) &&
         ((iVar1 = bio_fwrite(&n_density,4,1,fp,0,&chksum), iVar1 == 1 &&
          (iVar2 = bio_fwrite_1d(veclen,4,n_feat,fp,&chksum), -1 < iVar2)))) {
        iVar2 = 0;
        for (uVar3 = 0; n_feat != uVar3; uVar3 = uVar3 + 1) {
          iVar2 = iVar2 + veclen[uVar3];
        }
        d1 = iVar2 * n_cb_local * n_density;
        local_38 = dnom;
        if (has_means != 0) {
          band_nz_1d((float32 *)***wt_mean,d1,1.2e-38);
          iVar2 = bio_fwrite_1d(***wt_mean,4,d1,fp,&chksum);
          if (iVar2 < 0) {
            return -1;
          }
        }
        if (has_vars != 0) {
          floor_nz_1d((float32 *)***wt_var,d1,1.2e-38);
          iVar2 = bio_fwrite_1d(***wt_var,4,d1,fp,&chksum);
          if (iVar2 < 0) {
            return -1;
          }
        }
        arr = local_38;
        floor_nz_3d(local_38,n_cb_local,n_feat,n_density,1.2e-38);
        iVar2 = bio_fwrite_3d(arr,4,n_cb_local,n_feat,n_density,fp,&chksum);
        if (-1 < iVar2) {
          iVar1 = bio_fwrite(&chksum,4,1,fp,0,&ignore);
          s3close(fp);
          if (iVar1 == 1) {
            pcVar5 = " with means";
            if (has_means == 0) {
              pcVar5 = "";
            }
            pcVar6 = " (2pass)";
            if (pass2var_local == 0) {
              pcVar6 = "";
            }
            pcVar7 = " with vars";
            if (has_vars == 0) {
              pcVar7 = "";
              pcVar6 = "";
            }
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_io.c"
                    ,0x1e5,"Wrote %s%s%s%s [%ux%ux%u vector arrays]\n",fn,pcVar5,pcVar7,pcVar6,
                    (ulong)n_cb_local,(ulong)n_feat,(ulong)n_density);
            iVar4 = 0;
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int
s3gaucnt_write(const char *fn,
	       vector_t ***wt_mean,
	       vector_t ***wt_var,
	       int32 pass2var,
	       float32 ***dnom,
	       uint32 n_cb,
	       uint32 n_feat,
	       uint32 n_density,
	       const uint32 *veclen)
{
    FILE *fp;
    uint32 chksum = 0;
    uint32 ignore = 0;
    uint32 n_elem, blk, j, has_means, has_vars;

    s3clr_fattr();
    s3add_fattr("version", GAUCNT_FILE_VERSION, TRUE);
    s3add_fattr("chksum0", "yes", TRUE);

    fp = s3open(fn, "wb", NULL);
    if (fp == NULL)
	return S3_ERROR;


    if (wt_mean != NULL)
	has_means = TRUE;
    else
	has_means = FALSE;
    if (bio_fwrite((void *)&has_means, sizeof(uint32), 1, fp, 0, &chksum) != 1) {
	return S3_ERROR;
    }

    if (wt_var != NULL)
	has_vars = TRUE;
    else
	has_vars = FALSE;
    if (bio_fwrite((void *)&has_vars, sizeof(uint32), 1, fp, 0, &chksum) != 1) {
	return S3_ERROR;
    }
    if (bio_fwrite((void *)&pass2var, sizeof(uint32), 1, fp, 0, &chksum) != 1) {
	return S3_ERROR;
    }
    if (bio_fwrite((void *)&n_cb, sizeof(uint32), 1, fp, 0, &chksum) != 1) {
	return S3_ERROR;
    }
    if (bio_fwrite((void *)&n_density, sizeof(uint32), 1, fp, 0, &chksum) != 1) {
	return S3_ERROR;
    }

    if (bio_fwrite_1d((void *)veclen, sizeof(uint32), n_feat, fp, &chksum) < 0) {
	return S3_ERROR;
    }
    
    for (j = 0, blk = 0; j < n_feat; j++)
	blk += veclen[j];

    n_elem = n_cb * n_density * blk;

    if (has_means) {
	band_nz_1d(wt_mean[0][0][0], n_elem, MIN_POS_FLOAT32);
	
	if (bio_fwrite_1d((void *)wt_mean[0][0][0], sizeof(float32), n_elem, fp, &chksum) < 0)
	    return S3_ERROR;
    }

    if (has_vars) {
	floor_nz_1d(wt_var[0][0][0], n_elem, MIN_POS_FLOAT32);

	if (bio_fwrite_1d((void *)wt_var[0][0][0], sizeof(float32), n_elem, fp, &chksum) < 0)
	    return S3_ERROR;
    }

    /* floor all non-zero entries to this value to make sure
       that results are compatible between machines */
    floor_nz_3d(dnom, n_cb, n_feat, n_density, MIN_POS_FLOAT32);

    if (bio_fwrite_3d((void ***)dnom, sizeof(float32), n_cb, n_feat, n_density, fp, &chksum) < 0) {
	return S3_ERROR;
    }

    if (bio_fwrite(&chksum, sizeof(uint32), 1, fp, 0, &ignore) != 1) {
	s3close(fp);
	
	return S3_ERROR;
    }
	
    s3close(fp);

    E_INFO("Wrote %s%s%s%s [%ux%ux%u vector arrays]\n",
	   fn,
	   (has_means ? " with means" : ""),
	   (has_vars ? " with vars" : ""),
	   (has_vars && pass2var ? " (2pass)" : ""),
	   n_cb, n_feat, n_density);

    return S3_SUCCESS;
}